

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

void filemgr_dirty_update_set_immutable
               (filemgr *file,filemgr_dirty_update_node *prev_node,filemgr_dirty_update_node *node)

{
  int iVar1;
  avl_node *node_00;
  avl_node *paVar2;
  avl_node *paVar3;
  filemgr_dirty_update_node *node_01;
  filemgr_dirty_update_node *pfVar4;
  filemgr *pfVar5;
  filemgr *file_00;
  pthread_spinlock_t *__lock;
  filemgr *node_02;
  bool bVar6;
  void *addr;
  list remove_queue;
  filemgr_dirty_update_block query;
  avl_node *local_90;
  list local_88;
  avl_tree *local_78;
  filemgr_dirty_update_node *local_70;
  pthread_spinlock_t *local_68;
  avl_node local_60;
  avl_node *local_40;
  
  if (node != (filemgr_dirty_update_node *)0x0) {
    local_88.head = (list_elem *)0x0;
    local_88.tail = (list_elem *)0x0;
    __lock = &file->dirty_update_lock;
    pthread_spin_lock(__lock);
    node->immutable = true;
    if (prev_node != (filemgr_dirty_update_node *)0x0) {
      if (prev_node->immutable == true) {
        bVar6 = (prev_node->ref_count).super___atomic_base<unsigned_int>._M_i == 1;
      }
      else {
        bVar6 = false;
      }
      local_68 = __lock;
      if (prev_node->expired == false) {
        node_00 = avl_first(&prev_node->dirty_blocks);
      }
      else {
        node_00 = (avl_node *)0x0;
      }
      if (node_00 != (avl_node *)0x0) {
        local_78 = &prev_node->dirty_blocks;
        local_70 = prev_node;
        do {
          paVar2 = avl_next(node_00);
          if ((*(char *)&node_00[1].right == '\0') &&
             (iVar1 = filemgr_is_writable(file,(bid_t)node_00[1].left), iVar1 != 0)) {
            local_40 = node_00[1].left;
            paVar3 = avl_search(&node->dirty_blocks,&local_60,_dirty_blocks_cmp);
            if (paVar3 == (avl_node *)0x0) {
              if (bVar6) {
                avl_remove(local_78,node_00);
                paVar3 = node_00;
              }
              else {
                paVar3 = (avl_node *)calloc(1,0x30);
                iVar1 = posix_memalign(&local_90,0x200,(ulong)file->blocksize);
                if (iVar1 != 0) {
                  local_90 = (avl_node *)0x0;
                }
                paVar3[1].parent = local_90;
                paVar3[1].left = node_00[1].left;
                *(undefined1 *)&paVar3[1].right = *(undefined1 *)&node_00[1].right;
                memcpy(local_90,node_00[1].parent,(ulong)file->blocksize);
                prev_node = local_70;
              }
              avl_insert(&node->dirty_blocks,paVar3,_dirty_blocks_cmp);
            }
          }
          else {
            *(undefined1 *)&node_00[1].right = 1;
          }
          node_00 = paVar2;
        } while (paVar2 != (avl_node *)0x0);
      }
      prev_node->expired = true;
      __lock = local_68;
    }
    file->latest_dirty_update = node;
    node_01 = (filemgr_dirty_update_node *)avl_first(&file->dirty_update_idx);
    if (node_01 != node && node_01 != (filemgr_dirty_update_node *)0x0) {
      do {
        pfVar4 = (filemgr_dirty_update_node *)avl_next((avl_node *)node_01);
        if ((node_01->immutable == true) &&
           ((node_01->ref_count).super___atomic_base<unsigned_int>._M_i == 0)) {
          avl_remove(&file->dirty_update_idx,(avl_node *)node_01);
          list_push_front(&local_88,(list_elem *)node_01);
        }
      } while ((pfVar4 != (filemgr_dirty_update_node *)0x0) && (node_01 = pfVar4, pfVar4 != node));
    }
    pthread_spin_unlock(__lock);
    if ((filemgr *)local_88.head != (filemgr *)0x0) {
      file_00 = (filemgr *)local_88.head;
      do {
        node_02 = file_00;
        pfVar5 = (filemgr *)list_remove(&local_88,(list_elem *)file_00);
        _filemgr_dirty_update_remove_node(file_00,(filemgr_dirty_update_node *)node_02);
        file_00 = pfVar5;
      } while (pfVar5 != (filemgr *)0x0);
    }
  }
  return;
}

Assistant:

void filemgr_dirty_update_set_immutable(struct filemgr *file,
                                        struct filemgr_dirty_update_node *prev_node,
                                        struct filemgr_dirty_update_node *node)
{
    struct avl_node *a;
    struct filemgr_dirty_update_node *cur_node;
    struct list remove_queue;
    struct list_elem *le;

    if (!node) {
        return;
    }

    list_init(&remove_queue);

    spin_lock(&file->dirty_update_lock);
    node->immutable = true;

    // absorb all blocks that exist in the previous dirty update
    // but not exist in the current dirty update
    if (prev_node) {
        bool migration = false;
        struct avl_node *aa, *bb;
        struct filemgr_dirty_update_block *block, *block_copy, query;

        if (prev_node->immutable && atomic_get_uint32_t(&prev_node->ref_count) == 1) {
            // only the current thread is referring this dirty update entry.
            // we don't need to copy blocks; just migrate them directly.
            migration = true;
        }

        if (prev_node->expired) {
            // skip already copied node as its blocks are already in
            // the new node or DB file
            aa = NULL;
        } else {
            aa = avl_first(&prev_node->dirty_blocks);
        }

        while (aa) {
            block = _get_entry(aa, struct filemgr_dirty_update_block, avl);
            aa = avl_next(aa);

            if (block->immutable || !filemgr_is_writable(file, block->bid)) {
                // this block is already committed.
                // it can happen when previous dirty update was flushed but
                // was not closed as other handle was still referring it.

                // ignore this block and set the flag to avoid future copy
                // (filemgr_is_writable() alone is not enough because a block
                //  can become writable again due to circular block reuse).
                block->immutable = true;
                continue;
            }

            query.bid = block->bid;
            bb = avl_search(&node->dirty_blocks, &query.avl, _dirty_blocks_cmp);
            if (!bb) {
                // not exist in the current dirty update .. copy (or move) it
                if (migration) {
                    // move
                    avl_remove(&prev_node->dirty_blocks, &block->avl);
                    block_copy = block;
                } else {
                    // copy
                    block_copy = (struct filemgr_dirty_update_block *)
                                 calloc(1, sizeof(struct filemgr_dirty_update_block));
                    void *addr;
                    malloc_align(addr, FDB_SECTOR_SIZE, file->blocksize);
                    block_copy->addr = addr;
                    block_copy->bid = block->bid;
                    block_copy->immutable = block->immutable;
                    memcpy(block_copy->addr, block->addr, file->blocksize);
                }
                avl_insert(&node->dirty_blocks, &block_copy->avl, _dirty_blocks_cmp);
            }
        }

        // now we don't need to copy blocks in this node in the future
        prev_node->expired = true;
    }

    // set latest dirty update
    file->latest_dirty_update = node;

    // remove all previous dirty updates whose ref_count == 0
    // (except for 'node')
    a = avl_first(&file->dirty_update_idx);
    while (a) {
        cur_node = _get_entry(a, struct filemgr_dirty_update_node, avl);
        if (cur_node == node) {
            break;
        }
        a = avl_next(a);
        if (cur_node->immutable && atomic_get_uint32_t(&cur_node->ref_count) == 0 &&
            cur_node != node) {
            // detach from tree and insert into remove queue
            avl_remove(&file->dirty_update_idx, &cur_node->avl);
            list_push_front(&remove_queue, &cur_node->le);
        }
    }

    spin_unlock(&file->dirty_update_lock);

    le = list_begin(&remove_queue);
    while (le) {
        cur_node = _get_entry(le, struct filemgr_dirty_update_node, le);
        le = list_remove(&remove_queue, &cur_node->le);
        _filemgr_dirty_update_remove_node(file, cur_node);
    }
}